

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *pNtk,int nLutSize,int Id,int *pCounter)

{
  int iVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  uint Res1;
  uint Res0;
  uint i;
  uint iLit;
  Kit_DsdObj_t *pObj;
  int *pCounter_local;
  int Id_local;
  int nLutSize_local;
  Kit_DsdNtk_t *pNtk_local;
  
  pKVar3 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar3 == (Kit_DsdObj_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else if ((((uint)*pKVar3 >> 6 & 7) == 3) || (((uint)*pKVar3 >> 6 & 7) == 4)) {
    if ((uint)*pKVar3 >> 0x1a != 2) {
      __assert_fail("pObj->nFans == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x481,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
    }
    iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar3 + 1));
    iVar1 = Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar1,pCounter);
    iVar2 = Abc_Lit2Var((uint)*(ushort *)&pKVar3[1].field_0x2);
    iVar2 = Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar2,pCounter);
    if ((iVar1 == 0) && (iVar2 != 0)) {
      pNtk_local._4_4_ = iVar2 + -1;
    }
    else if ((iVar1 == 0) || (iVar2 != 0)) {
      *pCounter = *pCounter + 1;
      pNtk_local._4_4_ = nLutSize + -2;
    }
    else {
      pNtk_local._4_4_ = iVar1 + -1;
    }
  }
  else {
    if (((uint)*pKVar3 >> 6 & 7) != 5) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x48b,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
    }
    if (nLutSize < (int)((uint)*pKVar3 >> 0x1a)) {
      *pCounter = 1000;
      pNtk_local._4_4_ = 0;
    }
    else {
      for (Res1 = 0; Res1 < (uint)*pKVar3 >> 0x1a; Res1 = Res1 + 1) {
        iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar3[1].field_0x0 + (ulong)Res1 * 2));
        Kit_DsdCountLuts_rec(pNtk,nLutSize,iVar1,pCounter);
      }
      *pCounter = *pCounter + 1;
      pNtk_local._4_4_ = nLutSize - ((uint)*pKVar3 >> 0x1a);
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Kit_DsdCountLuts_rec( Kit_DsdNtk_t * pNtk, int nLutSize, int Id, int * pCounter )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, Res0, Res1;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        assert( pObj->nFans == 2 );
        Res0 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[0]), pCounter );
        Res1 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[1]), pCounter );
        if ( Res0 == 0 && Res1 > 0 )
            return Res1 - 1;
        if ( Res0 > 0 && Res1 == 0 )
            return Res0 - 1;
        (*pCounter)++;
        return nLutSize - 2;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    if ( (int)pObj->nFans > nLutSize ) //+ 1 )
    {
        *pCounter = 1000;
        return 0;
    }
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(iLit), pCounter );
    (*pCounter)++;
//    if ( (int)pObj->nFans == nLutSize + 1 )
//        (*pCounter)++;
    return nLutSize - pObj->nFans;
}